

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

htab_hash_t str_hash(tab_str_t str,void *arg)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar9 = str.str.len + 0x42;
  for (; 0xf < str.str.len; str.str.len = str.str.len - 0x10) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)str.str.s;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)((long)str.str.s + 8);
    str.str.s = (char *)((long)str.str.s + 0x10);
    uVar9 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar7,8) +
            SUB168(ZEXT816(0x288eea216831e6a7) * auVar7,0) ^
            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar6,8) +
            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar6,0) ^ uVar9;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    uVar9 = SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),8) +
            SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar9;
  }
  if (7 < str.str.len) {
    str.str.len = str.str.len - 8;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)str.str.s;
    str.str.s = (char *)((long)str.str.s + 8);
    uVar9 = uVar9 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar8,8) +
                    SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar8,0);
  }
  if (str.str.len != 0) {
    if (str.str.len < 4) {
      uVar11 = 0;
      uVar10 = 0;
    }
    else {
      uVar11 = 4;
      uVar10 = (ulong)(uint)*(ulong *)str.str.s << 0x20;
    }
    if (uVar11 < str.str.len) {
      do {
        pbVar1 = (byte *)((long)str.str.s + uVar11);
        uVar11 = uVar11 + 1;
        uVar10 = uVar10 >> 8 | (ulong)*pbVar1 << 0x38;
      } while (str.str.len != uVar11);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    uVar9 = uVar9 ^ SUB168(auVar3 * ZEXT816(0x288eea216831e6a7),8) +
                    SUB168(auVar3 * ZEXT816(0x288eea216831e6a7),0);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  uVar9 = SUB168(auVar4 * ZEXT816(0x65862b62bdf5ef4d),8) +
          SUB168(auVar4 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar9;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar9;
  return (uint)uVar9 ^
         SUB164(auVar5 * ZEXT816(0x288eea216831e6a7),8) +
         SUB164(auVar5 * ZEXT816(0x288eea216831e6a7),0);
}

Assistant:

static htab_hash_t str_hash (tab_str_t str, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash (str.str.s, str.str.len, 0x42);
}